

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileStdio::OpenChain
          (FileStdio *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  FILE *pFVar6;
  string *in_RCX;
  launch in_EDX;
  string *in_RSI;
  long *in_RDI;
  uint in_R8D;
  int token;
  type lf_AsyncOpenWrite;
  char *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  string *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  string *__fn;
  launch __policy;
  allocator local_189;
  string local_188 [40];
  string local_160 [32];
  string local_140 [32];
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int *in_stack_fffffffffffffef0;
  Comm *in_stack_fffffffffffffef8;
  Comm *in_stack_ffffffffffffff00;
  string local_f8 [8];
  string *in_stack_ffffffffffffff10;
  allocator local_d1;
  string local_d0 [39];
  undefined1 local_a9 [96];
  allocator<char> local_49;
  string *in_stack_ffffffffffffffb8;
  FileStdio *in_stack_ffffffffffffffc0;
  
  uVar1 = in_R8D & 1;
  __fn = in_RCX;
  __policy = in_EDX;
  std::__cxx11::string::operator=((string *)(in_RDI + 9),in_RSI);
  (**(code **)(*in_RDI + 0x98))();
  iVar2 = helper::Comm::Rank((Comm *)0xd50672);
  if (0 < iVar2) {
    in_stack_fffffffffffffe3c = helper::Comm::Rank((Comm *)0xd5068d);
    in_stack_fffffffffffffe3c = in_stack_fffffffffffffe3c + -1;
    in_stack_fffffffffffffe40 = (string *)&local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,"Chain token in FileStdio::OpenChain",
               (allocator *)in_stack_fffffffffffffe40);
    helper::Comm::Recv<int>
              (in_stack_ffffffffffffff00,(int *)in_stack_fffffffffffffef8,
               (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
               ,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator(&local_49);
    in_stack_fffffffffffffe30 = in_RCX;
  }
  *(launch *)(in_RDI + 0xd) = in_EDX;
  iVar2 = (int)in_RDI[0xd];
  if (iVar2 == 1) {
    if (uVar1 == 0) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pFVar6 = fopen(pcVar5,"wb");
      in_RDI[0x1e] = (long)pFVar6;
    }
    else {
      *(undefined1 *)(in_RDI + 0x1f) = 1;
      std::
      async<adios2::transport::FileStdio::OpenChain(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm_const&,bool,bool)::__0&,std::__cxx11::string_const&>
                (__policy,(type *)__fn,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_R8D,in_stack_fffffffffffffe48));
      std::future<_IO_FILE_*>::operator=
                ((future<_IO_FILE_*> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                 ,(future<_IO_FILE_*> *)in_stack_fffffffffffffde8);
      std::future<_IO_FILE_*>::~future((future<_IO_FILE_*> *)0xd50801);
    }
  }
  else if (iVar2 == 2) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pFVar6 = fopen(pcVar5,"rb");
    in_RDI[0x1e] = (long)pFVar6;
  }
  else if (iVar2 == 3) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pFVar6 = fopen(pcVar5,"rwb");
    in_RDI[0x1e] = (long)pFVar6;
    fseek((FILE *)in_RDI[0x1e],0,2);
  }
  else {
    in_stack_fffffffffffffe20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a9 + 1),"Toolkit",(allocator *)in_stack_fffffffffffffe20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"transport::file::FileStdio",&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Open",(allocator *)&stack0xffffffffffffff07);
    std::operator+((char *)CONCAT44(iVar2,in_stack_fffffffffffffe28),in_stack_fffffffffffffe20);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe40,
               (string *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30,(string *)CONCAT44(iVar2,in_stack_fffffffffffffe28),
               (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
  }
  if ((*(byte *)(in_RDI + 0x1f) & 1) == 0) {
    std::operator+((char *)CONCAT44(iVar2,in_stack_fffffffffffffe28),in_stack_fffffffffffffe20);
    std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    CheckFile(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    *(undefined1 *)((long)in_RDI + 0x6c) = 1;
  }
  iVar2 = helper::Comm::Rank((Comm *)0xd50bbf);
  iVar3 = helper::Comm::Size((Comm *)0xd50bd0);
  if (iVar2 < iVar3 + -1) {
    helper::Comm::Rank((Comm *)0xd50bf3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"Sending Chain token in FileStdio::OpenChain",&local_189)
    ;
    helper::Comm::Isend<int>
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_ffffffffffffff10);
    helper::Comm::Req::~Req((Req *)0xd50c6a);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  return;
}

Assistant:

void FileStdio::OpenChain(const std::string &name, Mode openMode, const helper::Comm &chainComm,
                          const bool async, const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };

    int token = 1;
    m_Name = name;
    CheckName();

    if (chainComm.Rank() > 0)
    {
        chainComm.Recv(&token, 1, chainComm.Rank() - 1, 0, "Chain token in FileStdio::OpenChain");
    }

    m_OpenMode = openMode;
    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }

    if (chainComm.Rank() < chainComm.Size() - 1)
    {
        chainComm.Isend(&token, 1, chainComm.Rank() + 1, 0,
                        "Sending Chain token in FileStdio::OpenChain");
    }
}